

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O2

ec_curve * ec_curve448(void)

{
  mp_int *p;
  mp_int *a;
  mp_int *b;
  mp_int *G_x;
  
  if (ec_curve448_initialised == '\0') {
    p = mp__from_string_literal
                  (
                  "0xfffffffffffffffffffffffffffffffffffffffffffffffffffffffeffffffffffffffffffffffffffffffffffffffffffffffffffffffff"
                  );
    a = mp__from_string_literal
                  (
                  "0x00000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000262a6"
                  );
    b = mp__from_string_literal
                  (
                  "0x0000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000001"
                  );
    G_x = mp__from_string_literal
                    (
                    "0x0000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000005"
                    );
    initialise_mcurve(&ec_curve448::curve,p,a,b,G_x,2);
    mp_free(p);
    mp_free(a);
    mp_free(b);
    mp_free(G_x);
    ec_curve448::curve.name = (char *)0x0;
    ec_curve448::curve.textname = "Curve448";
    ec_curve448_initialised = '\x01';
  }
  return &ec_curve448::curve;
}

Assistant:

static struct ec_curve *ec_curve448(void)
{
    static struct ec_curve curve = { 0 };
    static bool initialised = false;

    if (!initialised)
    {
        mp_int *p = MP_LITERAL(0xfffffffffffffffffffffffffffffffffffffffffffffffffffffffeffffffffffffffffffffffffffffffffffffffffffffffffffffffff);
        mp_int *a = MP_LITERAL(0x00000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000262a6);
        mp_int *b = MP_LITERAL(0x0000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000001);
        mp_int *G_x = MP_LITERAL(0x0000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000005);
        initialise_mcurve(&curve, p, a, b, G_x, 2);
        mp_free(p);
        mp_free(a);
        mp_free(b);
        mp_free(G_x);

        /* This curve doesn't need a name, because it's never used in
         * any format that embeds the curve name */
        curve.name = NULL;
        curve.textname = "Curve448";

        /* Now initialised, no need to do it again */
        initialised = true;
    }

    return &curve;
}